

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkTernaryPriority(CheckerVisitor *this,TerExpr *expr)

{
  bool bVar1;
  bool bVar2;
  TreeOp TVar3;
  LiteralKind LVar4;
  BinExpr *this_00;
  Node *this_01;
  LiteralExpr *this_02;
  char *pcVar5;
  TerExpr *in_RSI;
  CheckerVisitor *in_RDI;
  bool isIgnore;
  Expr *r;
  Expr *l;
  BinExpr *binCond;
  Expr *cond;
  Expr *in_stack_ffffffffffffffb0;
  undefined5 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbd;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 uVar6;
  
  if ((in_RDI->effectsOnly & 1U) == 0) {
    this_00 = (BinExpr *)TerExpr::a(in_RSI);
    TVar3 = Node::op((Node *)this_00);
    bVar1 = isSuspiciousTernaryConditionOp(TVar3);
    if (bVar1) {
      BinExpr::lhs(this_00);
      this_01 = &BinExpr::rhs(this_00)->super_Node;
      TVar3 = Node::op((Node *)this_00);
      uVar6 = false;
      bVar1 = (bool)uVar6;
      if (TVar3 == TO_AND) {
        bVar2 = isUpperCaseIdentifier
                          ((CheckerVisitor *)
                           (ulong)CONCAT16(in_stack_ffffffffffffffbe,
                                           CONCAT15(in_stack_ffffffffffffffbd,
                                                    in_stack_ffffffffffffffb8)),
                           in_stack_ffffffffffffffb0);
        bVar1 = true;
        if (!bVar2) {
          bVar2 = isUpperCaseIdentifier
                            ((CheckerVisitor *)
                             CONCAT17(uVar6,CONCAT16(1,CONCAT15(in_stack_ffffffffffffffbd,
                                                                in_stack_ffffffffffffffb8))),
                             in_stack_ffffffffffffffb0);
          bVar1 = true;
          if (!bVar2) {
            TVar3 = Node::op(this_01);
            bVar1 = false;
            if (TVar3 == TO_LITERAL) {
              this_02 = Expr::asLiteral((Expr *)this_01);
              LVar4 = LiteralExpr::kind(this_02);
              bVar1 = LVar4 == LK_INT;
            }
          }
        }
      }
      if (bVar1 == false) {
        TVar3 = Node::op((Node *)this_00);
        pcVar5 = treeopStr(TVar3);
        report(in_RDI,(Node *)this_00,0x46,pcVar5);
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkTernaryPriority(const TerExpr *expr) {
  if (effectsOnly)
    return;

  const Expr *cond = expr->a();

  if (isSuspiciousTernaryConditionOp(cond->op())) {
    const BinExpr *binCond = static_cast<const BinExpr *>(cond);
    const Expr *l = binCond->lhs();
    const Expr *r = binCond->rhs();
    bool isIgnore = cond->op() == TO_AND
      && (isUpperCaseIdentifier(l) || isUpperCaseIdentifier(r)
        || (r->op() == TO_LITERAL && r->asLiteral()->kind() == LK_INT));

    if (!isIgnore) {
      report(cond, DiagnosticsId::DI_TERNARY_PRIOR, treeopStr(cond->op()));
    }
  }
}